

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

kvtree_elem * kvtree_elem_extract_int(kvtree *hash,int key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *pkVar2;
  char tmp [100];
  char acStack_78 [104];
  
  sprintf(acStack_78,"%d",key);
  pkVar2 = kvtree_elem_get(hash,acStack_78);
  if (pkVar2 != (kvtree_elem *)0x0) {
    pkVar1 = (pkVar2->pointers).le_next;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = (pkVar2->pointers).le_prev;
    }
    *(pkVar2->pointers).le_prev = pkVar1;
  }
  return pkVar2;
}

Assistant:

kvtree_elem* kvtree_elem_extract_int(kvtree* hash, int key)
{
  char tmp[100];
  sprintf(tmp, "%d", key);

  kvtree_elem* elem = kvtree_elem_get(hash, tmp);
  if (elem != NULL) {
    LIST_REMOVE(elem, pointers);
  }
  return elem;
}